

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

IDiagObjectAddress * __thiscall
Js::LocalsWalker::FindPropertyAddress
          (LocalsWalker *this,PropertyId propId,bool enumerateGroups,bool *isConst)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *ppVVar3;
  undefined4 extraout_var_00;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  ResolvedObject local_70;
  
  *isConst = false;
  if ((propId == 0x1cf) && (this->hasUserNotDefinedArguments == true)) {
    local_70.propId = -1;
    local_70.isConst = false;
    local_70.address = (IDiagObjectAddress *)0x0;
    local_70.objectDisplay = (IDiagObjectModelDisplay *)0x0;
    local_70.obj = (Var)0x0;
    local_70.originalObj = (Var)0x0;
    local_70.name = (LPCWSTR)0x0;
    iVar1 = (*this->pFrame->_vptr_DiagStackFrame[10])();
    local_70.scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar1);
    CreateArgumentsObject(this,&local_70);
  }
  else {
    this_00 = this->pVarWalkers;
    if (this_00 !=
        (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      if ((this_00->
          super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
          count < 1) {
        return (IDiagObjectAddress *)0x0;
      }
      iVar1 = 0;
      do {
        ppVVar3 = JsUtil::
                  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,iVar1);
        if ((enumerateGroups) || (((*ppVVar3)->groupType & ~UIGroupType_Param) == UIGroupType_None))
        {
          ppVVar3 = JsUtil::
                    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this->pVarWalkers,iVar1);
          iVar2 = (*((*ppVVar3)->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase
                    [3])(*ppVVar3,(ulong)(uint)propId,isConst);
          if ((IDiagObjectAddress *)CONCAT44(extraout_var_00,iVar2) != (IDiagObjectAddress *)0x0) {
            return (IDiagObjectAddress *)CONCAT44(extraout_var_00,iVar2);
          }
        }
        iVar1 = iVar1 + 1;
        this_00 = this->pVarWalkers;
      } while (iVar1 < (this_00->
                       super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ).count);
    }
    local_70.address = (IDiagObjectAddress *)0x0;
  }
  return local_70.address;
}

Assistant:

IDiagObjectAddress * LocalsWalker::FindPropertyAddress(PropertyId propId, bool enumerateGroups, bool& isConst)
    {
        isConst = false;
        if (propId == PropertyIds::arguments && hasUserNotDefinedArguments)
        {
            ResolvedObject resolveObject;
            resolveObject.scriptContext = pFrame->GetScriptContext();
            if (CreateArgumentsObject(&resolveObject))
            {
                return resolveObject.address;
            }
        }

        if (pVarWalkers)
        {
            for (int i = 0; i < pVarWalkers->Count(); i++)
            {
                VariableWalkerBase *pVarWalker = pVarWalkers->Item(i);
                if (!enumerateGroups && !pVarWalker->IsWalkerForCurrentFrame())
                {
                    continue;
                }

                IDiagObjectAddress *address = pVarWalkers->Item(i)->FindPropertyAddress(propId, isConst);
                if (address != nullptr)
                {
                    return address;
                }
            }
        }

        return nullptr;
    }